

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O3

cf_bool_t cf_thread_equal(cf_thread_t t1,cf_thread_t t2)

{
  int iVar1;
  
  iVar1 = pthread_equal(t1,t2);
  return (cf_bool_t)(iVar1 != 0);
}

Assistant:

cf_bool_t cf_thread_equal(cf_thread_t t1, cf_thread_t t2) {
#ifdef CF_OS_WIN
    return (t1 == t2) ? CF_OK : CF_NOK;
#else
    if(pthread_equal(t1, t2)) return CF_TRUE;
    else return CF_FALSE;
#endif
}